

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  bool bVar1;
  uint uVar2;
  xpath_value_type xVar3;
  char_t *src;
  xpath_variable *pxVar4;
  ulong uVar5;
  xpath_variable *local_58;
  xpath_variable *result;
  xpath_variable *var;
  size_t hash;
  size_t hash_size;
  xpath_value_type type_local;
  char_t *name_local;
  xpath_variable_set *this_local;
  
  uVar2 = impl::anon_unknown_0::hash_string(name);
  uVar5 = (ulong)uVar2 & 0x3f;
  result = this->_data[uVar5];
  while( true ) {
    if (result == (xpath_variable *)0x0) {
      pxVar4 = impl::anon_unknown_0::new_xpath_variable(type,name);
      if (pxVar4 != (xpath_variable *)0x0) {
        pxVar4->_next = this->_data[uVar5];
        this->_data[uVar5] = pxVar4;
      }
      return pxVar4;
    }
    src = xpath_variable::name(result);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    if (bVar1) break;
    result = result->_next;
  }
  xVar3 = xpath_variable::type(result);
  if (xVar3 == type) {
    local_58 = result;
  }
  else {
    local_58 = (xpath_variable *)0x0;
  }
  return local_58;
}

Assistant:

PUGI__FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : 0;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}